

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo,int iCons)

{
  long lVar1;
  Expr *pLeft;
  CollSeq *pCVar2;
  char *pcVar3;
  
  if ((-1 < iCons) && (iCons < pIdxInfo->nConstraint)) {
    lVar1 = *(long *)(*(long *)(*(long *)(pIdxInfo + 1) + 0x20) +
                     (long)pIdxInfo->aConstraint[(uint)iCons].iTermOffset * 0x40);
    pLeft = *(Expr **)(lVar1 + 0x10);
    if (pLeft == (Expr *)0x0) {
      pCVar2 = (CollSeq *)0x0;
    }
    else {
      pCVar2 = sqlite3BinaryCompareCollSeq
                         ((Parse *)pIdxInfo[1].aConstraint,pLeft,*(Expr **)(lVar1 + 0x18));
    }
    if (pCVar2 == (CollSeq *)0x0) {
      pcVar3 = "BINARY";
    }
    else {
      pcVar3 = pCVar2->zName;
    }
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo, int iCons){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  const char *zRet = 0;
  if( iCons>=0 && iCons<pIdxInfo->nConstraint ){
    CollSeq *pC = 0;
    int iTerm = pIdxInfo->aConstraint[iCons].iTermOffset;
    Expr *pX = pHidden->pWC->a[iTerm].pExpr;
    if( pX->pLeft ){
      pC = sqlite3BinaryCompareCollSeq(pHidden->pParse, pX->pLeft, pX->pRight);
    }
    zRet = (pC ? pC->zName : sqlite3StrBINARY);
  }
  return zRet;
}